

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsc.c
# Opt level: O3

bsc_group_t bsc_group_create_partition(uint color)

{
  bsp_pid_t *pbVar1;
  bsp_size_t bVar2;
  uint uVar3;
  uint uVar4;
  void *addr;
  group_t *g;
  ulong uVar5;
  bsp_size_t bVar6;
  int iVar7;
  int in_EDI;
  uint pid;
  bool bVar8;
  int local_3c;
  ulong local_38;
  
  local_3c = in_EDI;
  uVar3 = bsp_nprocs();
  uVar4 = bsp_pid();
  addr = calloc((long)(int)uVar3,4);
  g = (group_t *)calloc(1,0x20);
  if (addr == (void *)0x0 || g == (group_t *)0x0) {
    bsp_abort("bsc_group_create_partition: Insufficient memory");
  }
  bsp_push_reg(addr,uVar3 * 4);
  bsp_sync();
  if ((int)uVar3 < 1) {
    bsp_sync();
  }
  else {
    pid = 0;
    local_38 = (ulong)uVar4;
    do {
      bsp_put(pid,&local_3c,addr,uVar4 * 4,4);
      pid = pid + 1;
    } while (uVar3 != pid);
    bsp_sync();
    if (0 < (int)uVar3) {
      uVar5 = 0;
      bVar6 = 0;
      iVar7 = 0;
      do {
        bVar2 = bVar6;
        if ((local_38 & 0xffffffff) == uVar5) {
          bVar2 = iVar7;
        }
        bVar8 = *(int *)((long)addr + uVar5 * 4) == local_3c;
        if (!bVar8) {
          bVar2 = bVar6;
        }
        bVar6 = bVar2;
        iVar7 = (uint)bVar8 + iVar7;
        uVar5 = uVar5 + 1;
      } while (uVar3 != uVar5);
      group_create(g,iVar7);
      if (0 < (int)uVar3) {
        pbVar1 = g->lid;
        uVar5 = 0;
        iVar7 = 0;
        do {
          if (*(int *)((long)addr + uVar5 * 4) == local_3c) {
            pbVar1[uVar5] = iVar7;
            g->rof[iVar7] = bVar6;
            g->gid[iVar7] = (bsp_pid_t)uVar5;
            iVar7 = iVar7 + 1;
          }
          else {
            pbVar1[uVar5] = -1;
          }
          uVar5 = uVar5 + 1;
        } while (uVar3 != uVar5);
      }
      goto LAB_00112590;
    }
  }
  group_create(g,0);
LAB_00112590:
  bsp_pop_reg(addr);
  bsp_sync();
  free(addr);
  return g;
}

Assistant:

bsc_group_t bsc_group_create_partition( unsigned color )
{
    bsp_pid_t i, j, P = bsp_nprocs(), s = bsp_pid();
    bsp_pid_t n_members = 0;
    bsp_pid_t rof = 0;
    unsigned * all_colors = calloc( P, sizeof(all_colors[0]) );
    group_t * g = calloc( 1, sizeof(*g) );
    if (!all_colors || !g)
        bsp_abort("bsc_group_create_partition: Insufficient memory");
    bsp_push_reg( all_colors, P * sizeof(all_colors[0]) );
    bsp_sync();

    /* all-gather the colors */
    for ( i = 0 ; i < P; ++i ) {
        bsp_put( i, &color, all_colors, sizeof(all_colors[0])*s,
                sizeof(all_colors[0]) );
    }
    bsp_sync();

    /* count number of members */
    for ( i = 0; i < P; ++i )
        if ( all_colors[i] == color ) {
            if (i == s ) rof = n_members;
            n_members += 1;
        }

    group_create( g, n_members );
    j = 0;
    for ( i = 0; i < P; ++i )
        if ( all_colors[i] == color ) {
            g->lid[ i ] = j;
            g->rof[ j ] = rof;
            g->gid[ j ] = i;
            j++;
        }
        else {
            g->lid[i] = -1;
        }

    bsp_pop_reg(all_colors);
    bsp_sync();
    free(all_colors);

    return g;
}